

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void compute_global_motion_for_ref_frame
               (AV1_COMP *cpi,aom_internal_error_info *error_info,YV12_BUFFER_CONFIG **ref_buf,
               int frame,MotionModel *motion_models,uint8_t *segment_map,int segment_map_w,
               int segment_map_h,WarpedMotionParams *ref_params)

{
  _Bool _Var1;
  int iVar2;
  MotionModel *pMVar3;
  int64_t iVar4;
  int in_ECX;
  long in_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_RBP;
  aom_internal_error_info *in_RSI;
  long in_RDI;
  WarpedMotionParams *in_R8;
  WarpedMotionParams *in_R9;
  undefined8 unaff_R12;
  uint8_t *unaff_R13;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  uint8_t *puVar5;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  double erroradvantage;
  int64_t warp_error;
  int64_t ref_frame_error;
  WarpedMotionParams tmp_wm_params;
  int i;
  TransformationType model;
  double best_erroradv;
  _Bool mem_alloc_failed;
  int gm_erroradv_tr_level;
  int num_refinements;
  int downsample_level;
  GlobalMotionMethod global_motion_method;
  int bit_depth;
  int src_stride;
  int src_height;
  int src_width;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined4 uVar6;
  WarpedMotionParams *model_00;
  undefined4 uVar7;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  TransformationType in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  MotionModel *in_stack_fffffffffffffee0;
  WarpedMotionParams *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  uint8_t *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  undefined1 local_cc [32];
  byte local_ac;
  int local_a8;
  byte local_a1;
  uint8_t *gm_erroradv_tr;
  uint3 in_stack_ffffffffffffff6c;
  uint r_width;
  int iVar8;
  int iVar9;
  int bd;
  int use_hbd;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  
  iVar12 = *(int *)(*(long *)(in_RDI + 0x427a8) + 0x10);
  uVar11 = *(undefined4 *)(*(long *)(in_RDI + 0x427a8) + 0x18);
  uVar10 = *(undefined4 *)(*(long *)(in_RDI + 0x427a8) + 0x20);
  use_hbd = *(int *)(*(long *)(in_RDI + 0x42008) + 0x48);
  bd = 1;
  iVar9 = *(int *)(in_RDI + 0x60944);
  iVar8 = *(int *)(in_RDI + 0x60948);
  r_width = (uint)in_stack_ffffffffffffff6c;
  gm_erroradv_tr = (uint8_t *)erroradv_tr[iVar8];
  for (local_a1 = 2; local_a1 < 3; local_a1 = local_a1 + 1) {
    uVar7 = 1;
    model_00 = in_R8;
    _Var1 = aom_compute_global_motion
                      (in_stack_fffffffffffffed6,
                       (YV12_BUFFER_CONFIG *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (YV12_BUFFER_CONFIG *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (int)((ulong)&stack0xffffffffffffff6f >> 0x20),
                       (GlobalMotionMethod)&stack0xffffffffffffff6f,in_stack_fffffffffffffeb4,
                       in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffee8,
                       (_Bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (_Var1) {
      for (local_a8 = 0; local_a8 < 1; local_a8 = local_a8 + 1) {
        if (*(int *)((long)in_R8 + (long)local_a8 * 0x40 + 0x38) != 0) {
          av1_convert_model_to_params((double *)CONCAT44(in_stack_fffffffffffffeb4,uVar7),model_00);
          iVar2 = av1_get_shear_params(in_stack_fffffffffffffee8);
          if ((iVar2 != 0) && (1 < local_ac)) {
            av1_compute_feature_segmentation_map
                      ((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8,
                       (int *)CONCAT17(in_stack_fffffffffffffed7,
                                       CONCAT16(in_stack_fffffffffffffed6,
                                                CONCAT24(in_stack_fffffffffffffed4,
                                                         in_stack_fffffffffffffed0))),
                       in_stack_fffffffffffffecc);
            uVar6 = (undefined4)((ulong)model_00 >> 0x20);
            uVar7 = uVar11;
            is_cur_buf_hbd((MACROBLOCKD *)(in_RDI + 0x151d0));
            model_00 = (WarpedMotionParams *)CONCAT44(uVar6,iVar12);
            in_stack_fffffffffffffec0 = in_stack_00000008;
            uVar11 = uVar7;
            pMVar3 = (MotionModel *)
                     av1_segmented_frame_error
                               (in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                                (uint8_t *)
                                CONCAT17(in_stack_fffffffffffffed7,
                                         CONCAT16(in_stack_fffffffffffffed6,
                                                  CONCAT24(in_stack_fffffffffffffed4,
                                                           in_stack_fffffffffffffed0))),
                                in_stack_fffffffffffffecc,
                                (uint8_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_00000008),
                                (int)((ulong)in_R9 >> 0x20),in_stack_fffffffffffffef0,
                                in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                                in_stack_ffffffffffffff08);
            if (pMVar3 != (MotionModel *)0x0) {
              in_stack_fffffffffffffed8 = iVar9;
              in_stack_fffffffffffffed0 = uVar10;
              in_stack_fffffffffffffec8 = uVar11;
              in_stack_fffffffffffffec0 = iVar12;
              is_cur_buf_hbd((MACROBLOCKD *)(in_RDI + 0x151d0));
              uVar7 = *(undefined4 *)(*(long *)(in_RDX + (long)in_ECX * 8) + 0x20);
              model_00 = (WarpedMotionParams *)
                         CONCAT44((int)((ulong)model_00 >> 0x20),
                                  *(undefined4 *)(*(long *)(in_RDX + (long)in_ECX * 8) + 0x18));
              in_stack_fffffffffffffee0 = pMVar3;
              in_stack_fffffffffffffee8 = in_R9;
              in_stack_fffffffffffffef0 = in_stack_00000008;
              iVar9 = in_stack_fffffffffffffed8;
              uVar10 = in_stack_fffffffffffffed0;
              uVar11 = in_stack_fffffffffffffec8;
              iVar12 = in_stack_fffffffffffffec0;
              iVar4 = av1_refine_integerized_param
                                ((WarpedMotionParams *)
                                 CONCAT44(in_stack_fffffffffffffec0,in_stack_fffffffffffffec8),
                                 (TransformationType)((uint)in_stack_fffffffffffffed0 >> 0x18),
                                 use_hbd,bd,(uint8_t *)CONCAT44(in_stack_fffffffffffffed8,iVar8),
                                 r_width,(int)unaff_RBX,(int)unaff_R12,unaff_R13,(int)unaff_R14,
                                 (int)unaff_R15,(int)unaff_RBP,unaff_retaddr,
                                 CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010,
                                 in_stack_00000018,(double)gm_erroradv_tr);
              if (1 < local_ac) {
                puVar5 = (uint8_t *)((double)iVar4 / (double)(long)pMVar3);
                in_stack_ffffffffffffff00 = puVar5;
                iVar2 = gm_get_params_cost((WarpedMotionParams *)
                                           CONCAT17(in_stack_fffffffffffffed7,
                                                    CONCAT16(in_stack_fffffffffffffed6,
                                                             CONCAT24(in_stack_fffffffffffffed4,
                                                                      in_stack_fffffffffffffed0))),
                                           (WarpedMotionParams *)
                                           CONCAT44(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8),
                                           in_stack_fffffffffffffec4);
                iVar2 = av1_is_enough_erroradvantage
                                  ((double)in_stack_ffffffffffffff00,iVar2,erroradv_tr[iVar8]);
                if ((iVar2 != 0) && ((double)puVar5 < (double)gm_erroradv_tr)) {
                  memcpy((void *)(in_RDI + 0x41ee4 + (long)in_ECX * 0x24),local_cc,0x24);
                  gm_erroradv_tr = puVar5;
                }
              }
            }
          }
        }
      }
    }
    else if ((r_width & 0x1000000) != 0) {
      aom_internal_error(in_RSI,AOM_CODEC_MEM_ERROR,"Failed to allocate global motion buffers");
    }
  }
  return;
}

Assistant:

static inline void compute_global_motion_for_ref_frame(
    AV1_COMP *cpi, struct aom_internal_error_info *error_info,
    YV12_BUFFER_CONFIG *ref_buf[REF_FRAMES], int frame,
    MotionModel *motion_models, uint8_t *segment_map, const int segment_map_w,
    const int segment_map_h, const WarpedMotionParams *ref_params) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  int src_width = cpi->source->y_crop_width;
  int src_height = cpi->source->y_crop_height;
  int src_stride = cpi->source->y_stride;
  assert(ref_buf[frame] != NULL);
  int bit_depth = cpi->common.seq_params->bit_depth;
  GlobalMotionMethod global_motion_method = default_global_motion_method;
  int downsample_level = cpi->sf.gm_sf.downsample_level;
  int num_refinements = cpi->sf.gm_sf.num_refinement_steps;
  int gm_erroradv_tr_level = cpi->sf.gm_sf.gm_erroradv_tr_level;
  bool mem_alloc_failed = false;

  assert(gm_erroradv_tr_level < 2);
  // Select the best model based on fractional error reduction.
  // By initializing this to erroradv_tr, the same logic which is used to
  // select the best model will automatically filter out any model which
  // doesn't meet the required quality threshold
  double best_erroradv = erroradv_tr[gm_erroradv_tr_level];
  for (TransformationType model = FIRST_GLOBAL_TRANS_TYPE;
       model <= LAST_GLOBAL_TRANS_TYPE; ++model) {
    if (!aom_compute_global_motion(model, cpi->source, ref_buf[frame],
                                   bit_depth, global_motion_method,
                                   downsample_level, motion_models,
                                   RANSAC_NUM_MOTIONS, &mem_alloc_failed)) {
      if (mem_alloc_failed) {
        aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate global motion buffers");
      }
      continue;
    }

    for (int i = 0; i < RANSAC_NUM_MOTIONS; ++i) {
      if (motion_models[i].num_inliers == 0) continue;

      WarpedMotionParams tmp_wm_params;
      av1_convert_model_to_params(motion_models[i].params, &tmp_wm_params);

      // Check that the generated model is warp-able
      if (!av1_get_shear_params(&tmp_wm_params)) continue;

      // Skip models that we won't use (IDENTITY or TRANSLATION)
      //
      // For IDENTITY type models, we don't need to evaluate anything because
      // all the following logic is effectively comparing the estimated model
      // to an identity model.
      //
      // For TRANSLATION type global motion models, gm_get_motion_vector() gives
      // the wrong motion vector (see comments in that function for details).
      // As translation-type models do not give much gain, we can avoid this bug
      // by never choosing a TRANSLATION type model
      if (tmp_wm_params.wmtype <= TRANSLATION) continue;

      av1_compute_feature_segmentation_map(
          segment_map, segment_map_w, segment_map_h, motion_models[i].inliers,
          motion_models[i].num_inliers);

      int64_t ref_frame_error = av1_segmented_frame_error(
          is_cur_buf_hbd(xd), xd->bd, ref_buf[frame]->y_buffer,
          ref_buf[frame]->y_stride, cpi->source->y_buffer, src_stride,
          src_width, src_height, segment_map, segment_map_w);

      if (ref_frame_error == 0) continue;

      const int64_t warp_error = av1_refine_integerized_param(
          &tmp_wm_params, tmp_wm_params.wmtype, is_cur_buf_hbd(xd), xd->bd,
          ref_buf[frame]->y_buffer, ref_buf[frame]->y_crop_width,
          ref_buf[frame]->y_crop_height, ref_buf[frame]->y_stride,
          cpi->source->y_buffer, src_width, src_height, src_stride,
          num_refinements, ref_frame_error, segment_map, segment_map_w,
          erroradv_tr[gm_erroradv_tr_level]);

      // av1_refine_integerized_param() can return a simpler model type than
      // its input, so re-check model type here
      if (tmp_wm_params.wmtype <= TRANSLATION) continue;

      double erroradvantage = (double)warp_error / ref_frame_error;

      // Check that the model signaling cost is not too high
      if (!av1_is_enough_erroradvantage(
              erroradvantage,
              gm_get_params_cost(&tmp_wm_params, ref_params,
                                 cm->features.allow_high_precision_mv),
              erroradv_tr[gm_erroradv_tr_level])) {
        continue;
      }

      if (erroradvantage < best_erroradv) {
        best_erroradv = erroradvantage;
        // Save the wm_params modified by
        // av1_refine_integerized_param() rather than motion index to
        // avoid rerunning refine() below.
        memcpy(&(cm->global_motion[frame]), &tmp_wm_params,
               sizeof(WarpedMotionParams));
      }
    }
  }
}